

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Str_t *
Acb_GeneratePatch(Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,Vec_Ptr_t *vSops,Vec_Ptr_t *vGias,
                 Vec_Int_t *vTars)

{
  char cVar1;
  uint uVar2;
  void **__ptr;
  void *__ptr_00;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Vec_Wec_t *vGates;
  Vec_Str_t *p_00;
  char *pcVar9;
  Vec_Int_t *vObjs;
  Vec_Int_t *vObjsDerefed;
  int *piVar10;
  char *pcVar11;
  uint nNodes;
  int iVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  int i_3;
  ulong uVar15;
  int i_8;
  Vec_Ptr_t *pVVar16;
  int i;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint local_f4;
  int nGates1 [5];
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  Vec_Ptr_t *local_68;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  ulong local_50;
  Acb_Ntk_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_58 = vTars;
  if (vGias == (Vec_Ptr_t *)0x0) {
    vGates = Abc_SopSynthesize(vSops);
    vGias = vSops;
  }
  else {
    vGates = Abc_GiaSynthesize(vGias,(Gia_Man_t *)0x0);
  }
  pVVar14 = local_58;
  uVar2 = vGias->nSize;
  nNodes = vGates->nSize - (vUsed->nSize + uVar2);
  nGates1[4] = 0;
  nGates1[0] = 0;
  nGates1[1] = 0;
  nGates1[2] = 0;
  nGates1[3] = 0;
  local_ac = 0;
  local_78 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_68 = Acb_GenerateSignalNames(p,vDivs,vUsed,nNodes,local_58,vGates);
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pcVar9 = (char *)malloc(100);
  p_00->pArray = pcVar9;
  vObjs = Acb_GetUsedDivs(vDivs,vUsed);
  vObjsDerefed = Acb_GetDerefedNodes(p);
  local_38 = Acb_ObjCollectTfiVec(p,vObjs);
  local_40 = Acb_ObjCollectTfoVec(p,pVVar14);
  uVar5 = Acb_NtkCountPiBuffers(p,vObjs);
  uVar6 = Acb_NtkCountPoDrivers(p,pVVar14);
  if (vObjsDerefed != (Vec_Int_t *)0x0) {
    iVar12 = pVVar14->nSize;
    iVar7 = Acb_NtkFindMffcSize(p,vObjs,vObjsDerefed,nGates1);
    local_ac = iVar7 + iVar12;
  }
  lVar18 = 0;
  local_60 = vObjsDerefed;
  piVar10 = Abc_FrameReadGateCounts();
  do {
    nGates1[lVar18] = nGates1[lVar18] + piVar10[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 5);
  if (vObjs->pArray != (int *)0x0) {
    free(vObjs->pArray);
  }
  free(vObjs);
  uVar13 = vUsed->nSize;
  if ((int)nNodes < 1) {
    uVar15 = 0;
    local_a8 = 0;
    local_8c = 0;
    local_f4 = 0;
    local_b0 = 0;
  }
  else {
    uVar15 = (ulong)uVar13 << 4 | 8;
    local_8c = 0;
    local_a8 = 0;
    local_50 = 0;
    uVar17 = uVar13;
    local_48 = p;
    do {
      if (((int)uVar13 < 0) || (vGates->nSize <= (int)uVar17)) goto LAB_0039a420;
      pVVar14 = vGates->pArray;
      iVar12 = *(int *)((long)pVVar14 + (uVar15 - 4));
      if (iVar12 < 3) {
        if (iVar12 < 1) goto LAB_0039a3c3;
        piVar10 = (int *)((long)&local_88 +
                         (ulong)(**(int **)((long)&pVVar14->nCap + uVar15) == 8) * 4);
        *piVar10 = *piVar10 + 1;
      }
      else {
        uVar8 = **(int **)((long)&pVVar14->nCap + uVar15) - 7;
        if ((0xb < uVar8) || ((0xff3U >> (uVar8 & 0x1f) & 1) == 0)) goto LAB_0039a43f;
        pcVar9 = (&PTR_anon_var_dwarf_ab6b2_00bbd190)[uVar8];
        iVar7 = strcmp(pcVar9,"buf");
        if (iVar7 == 0) {
          local_8c = local_8c + 1;
          p = local_48;
        }
        else {
          iVar7 = strcmp(pcVar9,"not");
          p = local_48;
          if (iVar7 == 0) {
            local_a8 = (ulong)((int)local_a8 + 1);
          }
          else {
            local_50 = (ulong)(((int)local_50 + iVar12) - 3);
          }
        }
      }
      uVar17 = uVar17 + 1;
      uVar15 = uVar15 + 0x10;
    } while ((int)uVar17 < (int)(uVar13 + nNodes));
    local_78 = (uint)local_50;
    uStack_80 = CONCAT44((int)local_a8,local_8c);
    local_b0 = (uint)local_88;
    local_f4 = local_88._4_4_;
    uVar15 = local_50;
  }
  Vec_StrPrintF(p_00,
                "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
                (ulong)uVar13,(ulong)uVar2,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)local_38->nSize,
                (ulong)(uint)local_40->nSize);
  Vec_StrPrintF(p_00,
                "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                (ulong)nNodes,(ulong)local_b0,(ulong)local_f4,(ulong)local_8c,local_a8,uVar15);
  if (local_60 != (Vec_Int_t *)0x0) {
    Vec_StrPrintF(p_00,
                  "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)local_ac,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
                  nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
    Vec_StrPrintF(p_00,
                  "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)(nNodes - local_ac),(ulong)(local_b0 - nGates1[0]),
                  (ulong)(local_f4 - nGates1[1]),(ulong)(local_8c - nGates1[2]),
                  (ulong)(uint)((int)local_a8 - nGates1[3]),(ulong)(uint)((int)uVar15 - nGates1[4]))
    ;
  }
  lVar18 = 0;
  Vec_StrPrintF(p_00,"\n");
  do {
    cVar1 = "module patch ("[lVar18];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    pVVar14 = local_58;
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xe);
  if (local_58->nSize != uVar2) {
    __assert_fail("Vec_IntSize(vTars) == nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x7c7,
                  "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  if (0 < (int)uVar2) {
    lVar18 = 0;
    do {
      uVar13 = pVVar14->pArray[lVar18];
      pcVar9 = ",";
      if (lVar18 == 0) {
        pcVar9 = "";
      }
      if ((long)(int)uVar13 < 1) goto LAB_0039a401;
      uVar17 = (p->vObjName).nSize;
      if ((int)uVar17 < 1) goto LAB_0039a3e2;
      if (uVar17 <= uVar13) goto LAB_0039a3c3;
      pcVar11 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar13]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar11);
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar14->nSize);
  }
  if (0 < vUsed->nSize) {
    lVar18 = 0;
    do {
      iVar12 = vUsed->pArray[lVar18];
      if (((long)iVar12 < 0) || (vDivs->nSize <= iVar12)) goto LAB_0039a3c3;
      uVar13 = vDivs->pArray[iVar12];
      if ((long)(int)uVar13 < 1) goto LAB_0039a401;
      uVar17 = (p->vObjName).nSize;
      if ((int)uVar17 < 1) goto LAB_0039a3e2;
      if (uVar17 <= uVar13) goto LAB_0039a3c3;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar13]);
      Vec_StrPrintF(p_00,", %s",pcVar9);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vUsed->nSize);
  }
  lVar18 = 0;
  do {
    cVar1 = "\n  );\n\n"[lVar18 + 2];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 5);
  lVar18 = 0;
  do {
    cVar1 = "  output"[lVar18];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    pVVar14 = local_58;
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  if (0 < local_58->nSize) {
    lVar18 = 0;
    do {
      uVar13 = pVVar14->pArray[lVar18];
      pcVar9 = ",";
      if (lVar18 == 0) {
        pcVar9 = "";
      }
      if ((long)(int)uVar13 < 1) goto LAB_0039a401;
      uVar17 = (p->vObjName).nSize;
      if ((int)uVar17 < 1) goto LAB_0039a3e2;
      if (uVar17 <= uVar13) goto LAB_0039a3c3;
      pcVar11 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar13]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar11);
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar14->nSize);
  }
  lVar18 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar18 + 0xb];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 2);
  lVar18 = 0;
  do {
    cVar1 = "  input"[lVar18];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 7);
  if (0 < vUsed->nSize) {
    lVar18 = 0;
    do {
      iVar12 = vUsed->pArray[lVar18];
      if (((long)iVar12 < 0) || (vDivs->nSize <= iVar12)) goto LAB_0039a3c3;
      uVar13 = vDivs->pArray[iVar12];
      pcVar9 = ",";
      if (lVar18 == 0) {
        pcVar9 = "";
      }
      if ((long)(int)uVar13 < 1) {
LAB_0039a401:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar17 = (p->vObjName).nSize;
      if ((int)uVar17 < 1) {
LAB_0039a3e2:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (uVar17 <= uVar13) goto LAB_0039a3c3;
      pcVar11 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar13]);
      Vec_StrPrintF(p_00,"%s %s",pcVar9,pcVar11);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vUsed->nSize);
  }
  pVVar16 = local_68;
  lVar18 = 0;
  do {
    cVar1 = " .%s(%s) ) ;\n"[lVar18 + 0xb];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 2);
  if ((int)uVar2 < (int)nNodes) {
    lVar18 = 0;
    do {
      cVar1 = "  wire"[lVar18];
      uVar13 = p_00->nSize;
      if (uVar13 == p_00->nCap) {
        if ((int)uVar13 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,0x10);
          }
          p_00->pArray = pcVar9;
          p_00->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar13 * 2;
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar3);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,sVar3);
          }
          p_00->pArray = pcVar9;
          p_00->nCap = (int)sVar3;
        }
      }
      else {
        pcVar9 = p_00->pArray;
      }
      iVar12 = p_00->nSize;
      p_00->nSize = iVar12 + 1;
      pcVar9[iVar12] = cVar1;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 6);
    if (0 < (int)nNodes) {
      bVar4 = true;
      uVar13 = 0;
      do {
        uVar17 = vUsed->nSize + uVar13;
        if (((int)uVar17 < 0) || (pVVar16->nSize <= (int)uVar17)) goto LAB_0039a3a4;
        if ((*pVVar16->pArray[uVar17] == 'w') &&
           (*(char *)((long)pVVar16->pArray[uVar17] + 1) == 'w')) {
          pcVar9 = "";
          if (!bVar4) {
            pcVar9 = ",";
          }
          bVar4 = false;
          Vec_StrPrintF(p_00,"%s %s",pcVar9);
        }
        uVar13 = uVar13 + 1;
      } while (nNodes != uVar13);
    }
    lVar18 = 0;
    do {
      cVar1 = "\n);\n\n"[lVar18 + 2];
      uVar13 = p_00->nSize;
      if (uVar13 == p_00->nCap) {
        if ((int)uVar13 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,0x10);
          }
          p_00->pArray = pcVar9;
          p_00->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar13 * 2;
          if (p_00->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(sVar3);
          }
          else {
            pcVar9 = (char *)realloc(p_00->pArray,sVar3);
          }
          p_00->pArray = pcVar9;
          p_00->nCap = (int)sVar3;
        }
      }
      else {
        pcVar9 = p_00->pArray;
      }
      iVar12 = p_00->nSize;
      p_00->nSize = iVar12 + 1;
      pcVar9[iVar12] = cVar1;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
  }
  if (0 < (int)nNodes) {
    uVar13 = vUsed->nSize;
    uVar15 = (ulong)uVar13;
    do {
      if (((int)uVar13 < 0) || (vGates->nSize <= (int)uVar15)) {
LAB_0039a420:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar14 = vGates->pArray;
      if (pVVar14[uVar15].nSize < 3) {
        if (pVVar14[uVar15].nSize < 1) {
LAB_0039a3c3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (1 < *pVVar14[uVar15].pArray - 7U) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x7f0,
                        "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                       );
        }
        Vec_StrPrintF(p_00,"  %s (","buf");
        if (pVVar14[uVar15].nSize < 2) goto LAB_0039a3c3;
        iVar12 = pVVar14[uVar15].pArray[1];
        if (((long)iVar12 < 0) || (pVVar16->nSize <= iVar12)) {
LAB_0039a3a4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Vec_StrPrintF(p_00," %s, ",pVVar16->pArray[iVar12]);
        if (pVVar14[uVar15].nSize < 1) goto LAB_0039a3c3;
        Vec_StrPrintF(p_00," 1\'b%d",(ulong)(*pVVar14[uVar15].pArray == 8));
        Vec_StrPrintF(p_00," );\n");
      }
      else {
        uVar17 = *pVVar14[uVar15].pArray - 7;
        if ((0xb < uVar17) || ((0xff3U >> (uVar17 & 0x1f) & 1) == 0)) {
LAB_0039a43f:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x66,"char *Acb_Oper2Name(int)");
        }
        Vec_StrPrintF(p_00,"  %s (",(&PTR_anon_var_dwarf_ab6b2_00bbd190)[uVar17]);
        if (1 < pVVar14[uVar15].nSize) {
          uVar19 = 1;
          do {
            iVar12 = pVVar14[uVar15].pArray[uVar19];
            pcVar9 = "";
            if (1 < uVar19) {
              pcVar9 = ",";
            }
            if (((long)iVar12 < 0) || (pVVar16->nSize <= iVar12)) goto LAB_0039a3a4;
            Vec_StrPrintF(p_00,"%s %s",pcVar9,pVVar16->pArray[iVar12]);
            uVar19 = uVar19 + 1;
          } while ((long)uVar19 < (long)pVVar14[uVar15].nSize);
        }
        lVar18 = 0;
        do {
          cVar1 = "\n  );\n"[lVar18 + 2];
          uVar17 = p_00->nSize;
          if (uVar17 == p_00->nCap) {
            if ((int)uVar17 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar9;
              p_00->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar17 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar3);
              }
              else {
                pcVar9 = (char *)realloc(p_00->pArray,sVar3);
              }
              p_00->pArray = pcVar9;
              p_00->nCap = (int)sVar3;
            }
          }
          else {
            pcVar9 = p_00->pArray;
          }
          iVar12 = p_00->nSize;
          p_00->nSize = iVar12 + 1;
          pcVar9[iVar12] = cVar1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
      }
      uVar15 = uVar15 + 1;
      pVVar16 = local_68;
    } while ((int)uVar15 < (int)(vUsed->nSize + nNodes));
  }
  lVar18 = 0;
  do {
    cVar1 = "\nendmodule\n\n"[lVar18];
    uVar13 = p_00->nSize;
    if (uVar13 == p_00->nCap) {
      if ((int)uVar13 < 0x10) {
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,0x10);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar13 * 2;
        if (p_00->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar3);
        }
        else {
          pcVar9 = (char *)realloc(p_00->pArray,sVar3);
        }
        p_00->pArray = pcVar9;
        p_00->nCap = (int)sVar3;
      }
    }
    else {
      pcVar9 = p_00->pArray;
    }
    iVar12 = p_00->nSize;
    p_00->nSize = iVar12 + 1;
    pcVar9[iVar12] = cVar1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xc);
  uVar13 = p_00->nSize;
  if (uVar13 == p_00->nCap) {
    if ((int)uVar13 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar13 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar3);
      }
      else {
        pcVar9 = (char *)realloc(p_00->pArray,sVar3);
      }
      p_00->pArray = pcVar9;
      p_00->nCap = (int)sVar3;
    }
  }
  else {
    pcVar9 = p_00->pArray;
  }
  iVar12 = p_00->nSize;
  p_00->nSize = iVar12 + 1;
  pcVar9[iVar12] = '\0';
  if (local_68 != (Vec_Ptr_t *)0x0) {
    iVar12 = local_68->nSize;
    __ptr = local_68->pArray;
    if ((long)iVar12 < 1) {
      if (__ptr != (void **)0x0) goto LAB_0039a1cb;
    }
    else {
      lVar18 = 0;
      do {
        if ((void *)0x2 < __ptr[lVar18]) {
          free(__ptr[lVar18]);
        }
        lVar18 = lVar18 + 1;
      } while (iVar12 != lVar18);
LAB_0039a1cb:
      free(__ptr);
    }
    free(local_68);
  }
  iVar12 = vGates->nCap;
  pVVar14 = vGates->pArray;
  if (iVar12 < 1) {
    if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0039a22f;
  }
  else {
    lVar18 = 8;
    lVar20 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar14->nCap + lVar18);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar14 = vGates->pArray;
        *(undefined8 *)((long)&pVVar14->nCap + lVar18) = 0;
        iVar12 = vGates->nCap;
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar20 < iVar12);
  }
  free(pVVar14);
LAB_0039a22f:
  free(vGates);
  putchar(10);
  printf("Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
         (ulong)(uint)vUsed->nSize,(ulong)uVar2,(ulong)uVar5,(ulong)uVar6,
         (ulong)(uint)local_38->nSize,(ulong)(uint)local_40->nSize);
  uVar6 = local_78;
  iVar12 = (uint)local_88;
  uVar2 = local_88._4_4_;
  iVar7 = (int)uStack_80;
  uVar5 = uStack_80._4_4_;
  printf("Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
         (ulong)nNodes,local_88 & 0xffffffff,(ulong)local_88._4_4_,uStack_80 & 0xffffffff,
         (ulong)uStack_80._4_4_,(ulong)local_78);
  if (local_60 == (Vec_Int_t *)0x0) {
    putchar(10);
  }
  else {
    printf("Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
           (ulong)local_ac,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
           nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
    printf("TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
           (ulong)(nNodes - local_ac),(ulong)(uint)(iVar12 - nGates1[0]),(ulong)(uVar2 - nGates1[1])
           ,(ulong)(uint)(iVar7 - nGates1[2]),(ulong)(uVar5 - nGates1[3]),
           (ulong)(uVar6 - nGates1[4]));
    putchar(10);
    pVVar14 = local_60;
    if (local_60->pArray != (int *)0x0) {
      free(local_60->pArray);
    }
    free(pVVar14);
  }
  return p_00;
}

Assistant:

Vec_Str_t * Acb_GeneratePatch( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, Vec_Ptr_t * vSops, Vec_Ptr_t * vGias, Vec_Int_t * vTars )
{
    extern Vec_Wec_t * Abc_SopSynthesize( Vec_Ptr_t * vSops );
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = vGias ? Abc_GiaSynthesize(vGias, NULL) : Abc_SopSynthesize(vSops);  Vec_Int_t * vGate;
    int nOuts = vGias ? Vec_PtrSize(vGias) : Vec_PtrSize(vSops);
    int i, k, iObj, nWires = Vec_WecSize(vGates) - Vec_IntSize(vUsed) - nOuts, fFirst = 1;
    int nGates1[5] = {0}, nGates0[5] = {0};
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames( p, vDivs, vUsed, nWires, vTars, vGates );
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_Int_t * vSup = Acb_GetUsedDivs( vDivs, vUsed );
    Vec_Int_t * vDrf = Acb_GetDerefedNodes( p );
    Vec_Int_t * vTfi = Acb_ObjCollectTfiVec( p, vSup );
    Vec_Int_t * vTfo = Acb_ObjCollectTfoVec( p, vTars );
    int nPiCount = Acb_NtkCountPiBuffers( p, vSup );
    int nPoCount = Acb_NtkCountPoDrivers( p, vTars );
    int nMffc    = vDrf ? Vec_IntSize(vTars) + Acb_NtkFindMffcSize( p, vSup, vDrf, nGates1 ) : 0;
    int * pCounts = Abc_FrameReadGateCounts();
    for ( i = 0; i < 5; i++ )
        nGates1[i] += pCounts[i];
    Vec_IntFree( vSup );
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            char * pName = Acb_Oper2Name(Vec_IntEntry(vGate, 0));
            if ( !strcmp(pName, "buf") )
                nGates0[2]++;
            else if ( !strcmp(pName, "not") )
                nGates0[3]++;
            else
                nGates0[4] += Vec_IntSize(vGate) - 3;
        }
        else
            nGates0[Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T]++;
    }

    Vec_StrPrintF( vStr, "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    Vec_StrPrintF( vStr, "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc, nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    Vec_StrPrintF( vStr, "\n" );

    Vec_StrAppend( vStr, "module patch (" );

    assert( Vec_IntSize(vTars) == nOuts );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, ", %s", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, Vec_IntSize(vUsed)+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

//    printf( "Synthesized patch with %d inputs, %d outputs and %d gates (const = %d  buf = %d  inv = %d  other = %d).\n", 
//        Vec_IntSize(vUsed), nOuts, nWires, nConst, nBufs, nInvs, nNodes );
//    printf( "Summary of the results\n" );
    printf( "\n" );
    printf( "Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    printf( "Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    printf( "Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    printf( "TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc,   nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    printf( "\n" );
    Vec_IntFreeP( &vDrf );
    return vStr;
}